

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fld.c
# Opt level: O1

void fld_export(uint8_t *dst,limb_t *src)

{
  long lVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  fld_t tmp;
  limb_t local_38 [6];
  
  fld_reduce(local_38,src);
  lVar1 = 0;
  iVar3 = 0;
  uVar4 = 0;
  do {
    uVar4 = local_38[lVar1] << ((byte)iVar3 & 0x3f) | uVar4;
    if (iVar3 < -0x2b) {
      iVar3 = iVar3 + 0x33;
    }
    else {
      iVar2 = iVar3 + 0x3b;
      do {
        iVar3 = iVar2;
        *dst = (uint8_t)uVar4;
        dst = dst + 1;
        uVar4 = uVar4 >> 8;
        iVar2 = iVar3 + -8;
      } while (0xf < iVar2);
      iVar3 = iVar3 + -0x10;
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  *dst = (uint8_t)uVar4;
  return;
}

Assistant:

void
fld_export(uint8_t dst[32], const fld_t src)
{
	int i;
	fld_t tmp;
	uint64_t foo = 0;
	int fill = 0;
	
	fld_reduce(tmp, src);

	for (i = 0; i < FLD_LIMB_NUM; i++) {
		foo |= (uint64_t)tmp[i] << fill;
		for (fill += FLD_LIMB_BITS; fill >= 8; fill -= 8, foo >>= 8)
			*dst++ = foo & 0xff;
	}
	*dst++ = foo & 0xff;
}